

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::GroupedAggregateHashTable::~GroupedAggregateHashTable(GroupedAggregateHashTable *this)

{
  ~GroupedAggregateHashTable(this);
  operator_delete(this);
  return;
}

Assistant:

GroupedAggregateHashTable::~GroupedAggregateHashTable() {
	Destroy();
}